

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_shifted_register.c
# Opt level: O0

void move_shifted_register(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  status_register_t *psVar3;
  ushort *in_RSI;
  arm7tdmi_t *in_RDI;
  uint32_t value_4;
  uint32_t value_2;
  uint32_t value;
  move_shifted_register_t *instr;
  uint32_t value_5;
  uint32_t value_3;
  uint32_t value_1;
  status_register_t *psr_2;
  status_register_t *psr_1;
  status_register_t *psr;
  undefined8 in_stack_fffffffffffffe18;
  uint32_t shift_amount;
  uint32_t data;
  arm7tdmi_t *in_stack_fffffffffffffe20;
  shift_type_t type;
  status_register_t *in_stack_fffffffffffffe28;
  shift_type_t type_00;
  status_register_t *in_stack_fffffffffffffe30;
  arm7tdmi_t *in_stack_fffffffffffffe38;
  uint local_184;
  uint local_180;
  uint local_17c;
  
  uVar1 = *in_RSI >> 0xb & 3;
  type_00 = (shift_type_t)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  shift_amount = (uint32_t)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  data = (uint32_t)in_stack_fffffffffffffe20;
  type = (shift_type_t)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  if ((*in_RSI >> 0xb & 3) == 0) {
    uVar2 = (uint)(*in_RSI >> 3 & 7);
    if ((((((in_RDI->cpsr).raw & 0x1f) != 0x11) || (uVar2 < 8)) || (0xc < uVar2)) && (0xc < uVar2))
    {
      if (uVar2 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar2 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
    }
    if ((*in_RSI >> 6 & 0x1f) == 0) {
      local_17c = arm_shift_special_zero_behavior
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,type_00,
                             (uint32_t)in_stack_fffffffffffffe28);
    }
    else {
      local_17c = arm_shift(in_stack_fffffffffffffe28,type,data,shift_amount);
    }
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)local_17c);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = local_17c;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = local_17c;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = local_17c;
        break;
      case 0x12:
        in_RDI->sp_irq = local_17c;
        break;
      case 0x13:
        in_RDI->sp_svc = local_17c;
        break;
      default:
        in_RDI->sp = local_17c;
        break;
      case 0x17:
        in_RDI->sp_abt = local_17c;
        break;
      case 0x1b:
        in_RDI->sp_und = local_17c;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = local_17c;
        break;
      case 0x12:
        in_RDI->lr_irq = local_17c;
        break;
      case 0x13:
        in_RDI->lr_svc = local_17c;
        break;
      default:
        in_RDI->lr = local_17c;
        break;
      case 0x17:
        in_RDI->lr_abt = local_17c;
        break;
      case 0x1b:
        in_RDI->lr_und = local_17c;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffe20,shift_amount);
      }
      else {
        set_pc(in_stack_fffffffffffffe20,shift_amount);
      }
    }
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(local_17c == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)local_17c < 0) << 0x1f;
  }
  else if (uVar1 == 1) {
    uVar2 = (uint)(*in_RSI >> 3 & 7);
    if ((((((in_RDI->cpsr).raw & 0x1f) != 0x11) || (uVar2 < 8)) || (0xc < uVar2)) && (0xc < uVar2))
    {
      if (uVar2 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar2 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          break;
        case 0x12:
          break;
        case 0x13:
          break;
        default:
          break;
        case 0x17:
          break;
        case 0x1b:
        }
      }
      else if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
    }
    if ((*in_RSI >> 6 & 0x1f) == 0) {
      local_180 = arm_shift_special_zero_behavior
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,type_00,
                             (uint32_t)in_stack_fffffffffffffe28);
    }
    else {
      local_180 = arm_shift(in_stack_fffffffffffffe28,type,data,shift_amount);
    }
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)local_180);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = local_180;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = local_180;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = local_180;
        break;
      case 0x12:
        in_RDI->sp_irq = local_180;
        break;
      case 0x13:
        in_RDI->sp_svc = local_180;
        break;
      default:
        in_RDI->sp = local_180;
        break;
      case 0x17:
        in_RDI->sp_abt = local_180;
        break;
      case 0x1b:
        in_RDI->sp_und = local_180;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = local_180;
        break;
      case 0x12:
        in_RDI->lr_irq = local_180;
        break;
      case 0x13:
        in_RDI->lr_svc = local_180;
        break;
      default:
        in_RDI->lr = local_180;
        break;
      case 0x17:
        in_RDI->lr_abt = local_180;
        break;
      case 0x1b:
        in_RDI->lr_und = local_180;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffe20,shift_amount);
      }
      else {
        set_pc(in_stack_fffffffffffffe20,shift_amount);
      }
    }
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(local_180 == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)local_180 < 0) << 0x1f;
  }
  else {
    if (uVar1 != 2) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/move_shifted_register.c"
              ,0x2c);
      fprintf(_stderr,"Unknown MSR opcode: %d\n\x1b[0;m",(ulong)(*in_RSI >> 0xb & 3));
      exit(1);
    }
    uVar2 = (uint)(*in_RSI >> 3 & 7);
    if ((((((in_RDI->cpsr).raw & 0x1f) != 0x11) || (uVar2 < 8)) || (0xc < uVar2)) && (0xc < uVar2))
    {
      if (uVar2 == 0xd) {
        in_stack_fffffffffffffe30 = (status_register_t *)(ulong)(((in_RDI->cpsr).raw & 0x1f) - 0x11)
        ;
        switch(in_stack_fffffffffffffe30) {
        case (status_register_t *)0x0:
          break;
        case (status_register_t *)0x1:
          break;
        case (status_register_t *)0x2:
          break;
        default:
          break;
        case (status_register_t *)0x6:
          break;
        case (status_register_t *)0xa:
        }
      }
      else if (uVar2 == 0xe) {
        in_stack_fffffffffffffe28 = (status_register_t *)(ulong)(((in_RDI->cpsr).raw & 0x1f) - 0x11)
        ;
        switch(in_stack_fffffffffffffe28) {
        case (status_register_t *)0x0:
          break;
        case (status_register_t *)0x1:
          break;
        case (status_register_t *)0x2:
          break;
        default:
          break;
        case (status_register_t *)0x6:
          break;
        case (status_register_t *)0xa:
        }
      }
      else if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
    }
    if ((*in_RSI >> 6 & 0x1f) == 0) {
      local_184 = arm_shift_special_zero_behavior
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                             (shift_type_t)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                             (uint32_t)in_stack_fffffffffffffe28);
    }
    else {
      local_184 = arm_shift(in_stack_fffffffffffffe28,type,data,shift_amount);
    }
    uVar2 = (uint)(*in_RSI & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)local_184);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      in_RDI->highreg_fiq[uVar2 - 8] = local_184;
    }
    else if (uVar2 < 0xd) {
      in_RDI->r[uVar2] = local_184;
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = local_184;
        break;
      case 0x12:
        in_RDI->sp_irq = local_184;
        break;
      case 0x13:
        in_RDI->sp_svc = local_184;
        break;
      default:
        in_RDI->sp = local_184;
        break;
      case 0x17:
        in_RDI->sp_abt = local_184;
        break;
      case 0x1b:
        in_RDI->sp_und = local_184;
      }
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = local_184;
        break;
      case 0x12:
        in_RDI->lr_irq = local_184;
        break;
      case 0x13:
        in_RDI->lr_svc = local_184;
        break;
      default:
        in_RDI->lr = local_184;
        break;
      case 0x17:
        in_RDI->lr_abt = local_184;
        break;
      case 0x1b:
        in_RDI->lr_und = local_184;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffe20,shift_amount);
      }
      else {
        set_pc(in_stack_fffffffffffffe20,shift_amount);
      }
    }
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(local_184 == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)local_184 < 0) << 0x1f;
  }
  return;
}

Assistant:

void move_shifted_register(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    move_shifted_register_t* instr = &thminstr->MOVE_SHIFTED_REGISTER;
    switch (instr->opcode) {
        case 0: { // LSL
            word value = get_register(state, instr->rs);
            if (instr->offset == 0) {
                // No shift performed and carry flag not updated
                value = arm_shift_special_zero_behavior(state, &state->cpsr, LSL, value);
            } else {
                value = arm_shift(&state->cpsr, LSL, value, instr->offset);
            }
            set_register(state, instr->rd, value);
            set_flags_nz(state, value);
            break;
        }
        case 1: { // LSR
            word value = get_register(state, instr->rs);
            if (instr->offset == 0) {
                // No shift performed and carry flag not updated
                value = arm_shift_special_zero_behavior(state, &state->cpsr, LSR, value);
            } else {
                value = arm_shift(&state->cpsr, LSR, value, instr->offset);
            }
            set_register(state, instr->rd, value);
            set_flags_nz(state, value);
            break;
        }
        case 2: { // ASR
            word value = get_register(state, instr->rs);
            if (instr->offset == 0) {
                // No shift performed and carry flag not updated
                value = arm_shift_special_zero_behavior(state, &state->cpsr, ASR, value);
            } else {
                value = arm_shift(&state->cpsr, ASR, value, instr->offset);
            }
            set_register(state, instr->rd, value);
            set_flags_nz(state, value);
            break;
        }
        default:
            logfatal("Unknown MSR opcode: %d", instr->opcode)
    }
}